

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test10::prepareFunctions(GPUShaderFP64Test10 *this)

{
  value_type local_d8 [50];
  GPUShaderFP64Test10 *local_10;
  GPUShaderFP64Test10 *this_local;
  
  local_d8[0x31] = 0;
  local_10 = this;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x31);
  local_d8[0x30] = 1;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x30);
  local_d8[0x2f] = 2;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x2f);
  local_d8[0x2e] = 3;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x2e);
  local_d8[0x2d] = 4;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x2d);
  local_d8[0x2c] = 5;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x2c);
  local_d8[0x2b] = 6;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x2b);
  local_d8[0x2a] = 7;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x2a);
  local_d8[0x29] = 8;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x29);
  local_d8[0x28] = 9;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x28);
  local_d8[0x27] = 10;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x27);
  local_d8[0x26] = 0xb;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x26);
  local_d8[0x25] = 0xc;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x25);
  local_d8[0x24] = 0xd;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x24);
  local_d8[0x23] = 0xe;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x23);
  local_d8[0x22] = 0xf;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x22);
  local_d8[0x21] = 0x10;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x21);
  local_d8[0x20] = 0x11;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x20);
  local_d8[0x1f] = 0x12;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x1f);
  local_d8[0x1e] = 0x13;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x1e);
  local_d8[0x1d] = 0x14;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x1d);
  local_d8[0x1c] = 0x15;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x1c);
  local_d8[0x1b] = 0x16;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x1b);
  local_d8[0x1a] = 0x17;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x1a);
  local_d8[0x19] = 0x18;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x19);
  local_d8[0x18] = 0x19;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x18);
  local_d8[0x17] = 0x1a;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x17);
  local_d8[0x16] = 0x1b;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x16);
  local_d8[0x15] = 0x1c;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x15);
  local_d8[0x14] = 0x1d;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x14);
  local_d8[0x13] = 0x1e;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x13);
  local_d8[0x12] = 0x1f;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x12);
  local_d8[0x11] = 0x20;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x11);
  local_d8[0x10] = 0x21;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0x10);
  local_d8[0xf] = 0x22;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0xf);
  local_d8[0xe] = 0x23;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0xe);
  local_d8[0xd] = 0x24;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0xd);
  local_d8[0xc] = 0x25;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0xc);
  local_d8[0xb] = 0x26;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 0xb);
  local_d8[10] = 0x27;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 10);
  local_d8[9] = 0x28;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 9);
  local_d8[8] = 0x29;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 8);
  local_d8[7] = 0x2a;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 7);
  local_d8[6] = 0x2b;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 6);
  local_d8[5] = 0x2c;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 5);
  local_d8[4] = 0x2d;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 4);
  local_d8[3] = 0x2e;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 3);
  local_d8[2] = 0x2f;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 2);
  local_d8[1] = 0x30;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8 + 1);
  local_d8[0] = FUNCTION_ISINF;
  std::
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  ::push_back(&this->m_functions,local_d8);
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareFunctions()
{
	m_functions.push_back(FUNCTION_ABS);
	m_functions.push_back(FUNCTION_CEIL);
	m_functions.push_back(FUNCTION_CLAMP);
	m_functions.push_back(FUNCTION_CLAMP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_CROSS);
	m_functions.push_back(FUNCTION_DETERMINANT);
	m_functions.push_back(FUNCTION_DISTANCE);
	m_functions.push_back(FUNCTION_DOT);
	m_functions.push_back(FUNCTION_EQUAL);
	m_functions.push_back(FUNCTION_FACEFORWARD);
	m_functions.push_back(FUNCTION_FLOOR);
	m_functions.push_back(FUNCTION_FMA);
	m_functions.push_back(FUNCTION_FRACT);
	m_functions.push_back(FUNCTION_FREXP);
	m_functions.push_back(FUNCTION_GREATERTHAN);
	m_functions.push_back(FUNCTION_GREATERTHANEQUAL);
	m_functions.push_back(FUNCTION_INVERSE);
	m_functions.push_back(FUNCTION_INVERSESQRT);
	m_functions.push_back(FUNCTION_LDEXP);
	m_functions.push_back(FUNCTION_LESSTHAN);
	m_functions.push_back(FUNCTION_LESSTHANEQUAL);
	m_functions.push_back(FUNCTION_LENGTH);
	m_functions.push_back(FUNCTION_MATRIXCOMPMULT);
	m_functions.push_back(FUNCTION_MAX);
	m_functions.push_back(FUNCTION_MAX_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MIN);
	m_functions.push_back(FUNCTION_MIN_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MIX);
	m_functions.push_back(FUNCTION_MOD);
	m_functions.push_back(FUNCTION_MOD_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MODF);
	m_functions.push_back(FUNCTION_NORMALIZE);
	m_functions.push_back(FUNCTION_NOTEQUAL);
	m_functions.push_back(FUNCTION_OUTERPRODUCT);
	m_functions.push_back(FUNCTION_PACKDOUBLE2X32);
	m_functions.push_back(FUNCTION_REFLECT);
	m_functions.push_back(FUNCTION_REFRACT);
	m_functions.push_back(FUNCTION_ROUND);
	m_functions.push_back(FUNCTION_ROUNDEVEN);
	m_functions.push_back(FUNCTION_SIGN);
	m_functions.push_back(FUNCTION_SMOOTHSTEP);
	m_functions.push_back(FUNCTION_SMOOTHSTEP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_SQRT);
	m_functions.push_back(FUNCTION_STEP);
	m_functions.push_back(FUNCTION_STEP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_TRANSPOSE);
	m_functions.push_back(FUNCTION_TRUNC);
	m_functions.push_back(FUNCTION_UNPACKDOUBLE2X32);
	m_functions.push_back(FUNCTION_ISNAN);
	m_functions.push_back(FUNCTION_ISINF);
}